

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc_analyzer.cc
# Opt level: O2

void __thiscall
sptk::reaper::LpcAnalyzer::Autoc(LpcAnalyzer *this,int windowsize,float *s,int p,float *r,float *e)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  float *pfVar7;
  ulong uVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  
  fVar11 = 0.0;
  for (lVar5 = 0; windowsize != (int)lVar5; lVar5 = lVar5 + 1) {
    fVar11 = fVar11 + s[lVar5] * s[lVar5];
  }
  *r = 1.0;
  if ((fVar11 != 0.0) || (NAN(fVar11))) {
    fVar10 = fVar11 / (float)windowsize;
    if (fVar10 < 0.0) {
      fVar10 = sqrtf(fVar10);
    }
    else {
      fVar10 = SQRT(fVar10);
    }
    *e = fVar10;
    iVar3 = 0;
    if (0 < p) {
      iVar3 = p;
    }
    lVar5 = 4;
    for (uVar4 = 1; uVar4 != iVar3 + 1; uVar4 = uVar4 + 1) {
      iVar6 = windowsize - (int)uVar4;
      fVar10 = 0.0;
      pfVar7 = s;
      while (bVar9 = iVar6 != 0, iVar6 = iVar6 + -1, bVar9) {
        fVar2 = *pfVar7;
        pfVar1 = (float *)((long)pfVar7 + lVar5);
        pfVar7 = pfVar7 + 1;
        fVar10 = fVar10 + fVar2 * *pfVar1;
      }
      r[1] = fVar10 * (1.0 / fVar11);
      r = r + 1;
      lVar5 = lVar5 + 4;
    }
  }
  else {
    *e = 1.0;
    uVar4 = 0;
    uVar8 = (ulong)(uint)p;
    if (p < 1) {
      uVar8 = 0;
    }
    for (; uVar8 != uVar4; uVar4 = uVar4 + 1) {
      r[uVar4 + 1] = 0.0;
    }
  }
  return;
}

Assistant:

void LpcAnalyzer::Autoc(int windowsize, float* s, int p, float* r, float* e) {
  int i, j;
  float *q, *t, sum, sum0;

  for (i = windowsize, q = s, sum0 = 0.0; i--;) {
    sum = *q++;
    sum0 += sum*sum;
  }
  *r = 1.;                      /* r[0] will always = 1.0 */
  if (sum0 == 0.0) {            /* No energy: fake low-energy white noise. */
    *e = 1.;                    /* Arbitrarily assign 1 to rms. */
    /* Now fake autocorrelation of white noise. */
    for (i = 1; i <= p; i++) {
      r[i] = 0.;
    }
    return;
  }
  *e = sqrt(sum0 / windowsize);
  sum0 = 1.0 / sum0;
  for (i = 1; i <= p; i++) {
    for (sum = 0.0, j = windowsize - i, q = s, t = s + i; j--;)
      sum += (*q++) * (*t++);
    *(++r) = sum * sum0;  // normalizing by the inverse energy
  }
}